

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SimpleStringCacheTest.cpp
# Opt level: O2

void __thiscall
TEST_SimpleStringInternalCache_clearAllIncludingCurrentlyUsedMemoryAlsoReleasesLargeNonCachesMemory_Test
::
TEST_SimpleStringInternalCache_clearAllIncludingCurrentlyUsedMemoryAlsoReleasesLargeNonCachesMemory_Test
          (TEST_SimpleStringInternalCache_clearAllIncludingCurrentlyUsedMemoryAlsoReleasesLargeNonCachesMemory_Test
           *this)

{
  memset(this,0,0xa0);
  TEST_GROUP_CppUTestGroupSimpleStringInternalCache::
  TEST_GROUP_CppUTestGroupSimpleStringInternalCache
            (&this->super_TEST_GROUP_CppUTestGroupSimpleStringInternalCache);
  (this->super_TEST_GROUP_CppUTestGroupSimpleStringInternalCache).super_Utest._vptr_Utest =
       (_func_int **)&PTR__TEST_GROUP_CppUTestGroupSimpleStringInternalCache_00373388;
  return;
}

Assistant:

TEST(SimpleStringInternalCache, clearAllIncludingCurrentlyUsedMemoryAlsoReleasesLargeNonCachesMemory)
{
    cache.setAllocator(allocator);

    cache.alloc(1234);
    cache.alloc(1234);
    cache.alloc(1234);

    cache.clearAllIncludingCurrentlyUsedMemory();

    LONGS_EQUAL(3, accountant.totalAllocationsOfSize(1234));
    LONGS_EQUAL(3, accountant.totalDeallocationsOfSize(1234));
}